

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3CompareAffinity(Expr *pExpr,char aff2)

{
  byte bVar1;
  byte in_SIL;
  char aff1;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 local_1;
  
  bVar1 = sqlite3ExprAffinity((Expr *)CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffee,
                                                               in_stack_ffffffffffffffe8)));
  if ((bVar1 == 0) || (in_SIL == 0)) {
    if ((bVar1 == 0) && (in_SIL == 0)) {
      local_1 = 'A';
    }
    else {
      local_1 = bVar1 + in_SIL;
    }
  }
  else if ((bVar1 < 0x43) && (in_SIL < 0x43)) {
    local_1 = 'A';
  }
  else {
    local_1 = 'C';
  }
  return local_1;
}

Assistant:

SQLITE_PRIVATE char sqlite3CompareAffinity(Expr *pExpr, char aff2){
  char aff1 = sqlite3ExprAffinity(pExpr);
  if( aff1 && aff2 ){
    /* Both sides of the comparison are columns. If one has numeric
    ** affinity, use that. Otherwise use no affinity.
    */
    if( sqlite3IsNumericAffinity(aff1) || sqlite3IsNumericAffinity(aff2) ){
      return SQLITE_AFF_NUMERIC;
    }else{
      return SQLITE_AFF_BLOB;
    }
  }else if( !aff1 && !aff2 ){
    /* Neither side of the comparison is a column.  Compare the
    ** results directly.
    */
    return SQLITE_AFF_BLOB;
  }else{
    /* One side is a column, the other is not. Use the columns affinity. */
    assert( aff1==0 || aff2==0 );
    return (aff1 + aff2);
  }
}